

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O2

void __thiscall
ctemplate::TemplateDictionary::ShowTemplateGlobalSection
          (TemplateDictionary *this,TemplateString section_name)

{
  if (this->template_global_dict_owner_ != (TemplateDictionary *)0x0) {
    LazyCreateTemplateGlobalDict(this);
    ShowSection(this->template_global_dict_owner_->template_global_dict_,section_name);
    return;
  }
  __assert_fail("template_global_dict_owner_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                ,0x254,
                "void ctemplate::TemplateDictionary::ShowTemplateGlobalSection(const TemplateString)"
               );
}

Assistant:

void TemplateDictionary::ShowTemplateGlobalSection(
    const TemplateString section_name) {
  assert(template_global_dict_owner_ != NULL);
  LazyCreateTemplateGlobalDict();
  template_global_dict_owner_->template_global_dict_->
      ShowSection(section_name);
}